

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O2

bool __thiscall draco::ObjEncoder::EncodeFaces(ObjEncoder *this)

{
  undefined8 in_RAX;
  FaceIndex i;
  FaceIndex face_id;
  int j;
  int iVar1;
  undefined8 uStack_38;
  
  if (this->added_edges_att_ == (PointAttribute *)0x0) {
    uStack_38 = in_RAX;
    for (face_id.value_ = 0;
        face_id.value_ <
        (uint)(((long)(this->in_mesh_->faces_).vector_.
                      super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->in_mesh_->faces_).vector_.
                     super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0xc);
        face_id.value_ = face_id.value_ + 1) {
      EncodeFaceAttributes(this,face_id);
      uStack_38 = CONCAT17(0x66,(undefined7)uStack_38);
      EncoderBuffer::Encode<char>(this->out_buffer_,(char *)((long)&uStack_38 + 7));
      for (iVar1 = 0; iVar1 != 3; iVar1 = iVar1 + 1) {
        EncodeFaceCorner(this,face_id,iVar1);
      }
      EncoderBuffer::Encode(this->out_buffer_,"\n",1);
    }
  }
  else {
    EncodePolygonalFaces(this);
  }
  return true;
}

Assistant:

bool ObjEncoder::EncodeFaces() {
  if (added_edges_att_ != nullptr) {
    return EncodePolygonalFaces();
  }
  for (FaceIndex i(0); i < in_mesh_->num_faces(); ++i) {
    EncodeFaceAttributes(i);
    buffer()->Encode('f');
    for (int j = 0; j < 3; ++j) {
      if (!EncodeFaceCorner(i, j)) {
        return false;
      }
    }
    buffer()->Encode("\n", 1);
  }
  return true;
}